

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::fetchGatherArray2DOffsets
          (tcu *this,ConstPixelBufferAccess *src,Sampler *sampler,float s,float t,int depth,
          int componentNdx,IVec2 (*offsets) [4])

{
  int size;
  int size_00;
  int j;
  int k;
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  ChannelOrder extraout_XMM0_Da;
  ChannelOrder CVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar5;
  undefined4 in_XMM1_Db;
  Vec4 VVar7;
  Vec4 pixel;
  TextureFormat local_58;
  int aiStack_50 [2];
  long local_48;
  TextureFormat local_40;
  int aiStack_38 [2];
  undefined8 uVar6;
  
  uVar6 = CONCAT44(in_XMM1_Db,t);
  size = (src->m_size).m_data[0];
  size_00 = (src->m_size).m_data[1];
  fVar2 = unnormalize(sampler->wrapS,s,size);
  fVar3 = unnormalize(sampler->wrapT,t,size_00);
  fVar2 = floorf(fVar2 + -0.5);
  fVar3 = floorf(fVar3 + -0.5);
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  local_48 = (long)componentNdx;
  CVar4 = extraout_XMM0_Da;
  uVar5 = extraout_XMM0_Db;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    j = wrap(sampler->wrapS,(*offsets)[lVar1].m_data[0] + (int)fVar2,size);
    k = wrap(sampler->wrapT,(*offsets)[lVar1].m_data[1] + (int)fVar3,size_00);
    Vector<float,_4>::Vector((Vector<float,_4> *)&local_58);
    if ((j < size && -1 < j) && (k < size_00 && -1 < k)) {
      VVar7 = lookup((ConstPixelBufferAccess *)&local_40,(int)src,j,k);
      uVar6 = VVar7.m_data._8_8_;
    }
    else {
      VVar7 = lookupBorder((tcu *)&local_40,&src->m_format,sampler);
      uVar6 = VVar7.m_data._8_8_;
    }
    local_58 = local_40;
    aiStack_50[0] = aiStack_38[0];
    aiStack_50[1] = aiStack_38[1];
    CVar4 = (&local_58.order)[local_48];
    uVar5 = 0;
    *(ChannelOrder *)(this + lVar1 * 4) = CVar4;
  }
  VVar7.m_data[1] = (float)uVar5;
  VVar7.m_data[0] = (float)CVar4;
  VVar7.m_data[2] = (float)(int)uVar6;
  VVar7.m_data[3] = (float)(int)((ulong)uVar6 >> 0x20);
  return (Vec4)VVar7.m_data;
}

Assistant:

static Vec4 fetchGatherArray2DOffsets (const ConstPixelBufferAccess& src, const Sampler& sampler, float s, float t, int depth, int componentNdx, const IVec2 (&offsets)[4])
{
	DE_ASSERT(de::inBounds(componentNdx, 0, 4));

	const int		w	= src.getWidth();
	const int		h	= src.getHeight();
	const float		u	= unnormalize(sampler.wrapS, s, w);
	const float		v	= unnormalize(sampler.wrapT, t, h);
	const int		x0	= deFloorFloatToInt32(u-0.5f);
	const int		y0	= deFloorFloatToInt32(v-0.5f);

	Vec4			result;

	for (int i = 0; i < 4; i++)
	{
		const int	sampleX	= wrap(sampler.wrapS, x0 + offsets[i].x(), w);
		const int	sampleY	= wrap(sampler.wrapT, y0 + offsets[i].y(), h);
		Vec4		pixel;

		if (deInBounds32(sampleX, 0, w) && deInBounds32(sampleY, 0, h))
			pixel = lookup(src, sampleX, sampleY, depth);
		else
			pixel = lookupBorder(src.getFormat(), sampler);

		result[i] = pixel[componentNdx];
	}

	return result;
}